

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O1

bool __thiscall
gl3cts::ClipDistance::CoverageTest::ClipDistancesValuePassing(CoverageTest *this,Functions *gl)

{
  int iVar1;
  GLchar *pGVar2;
  GLenum GVar3;
  size_t sVar4;
  socklen_t __len;
  sockaddr *__addr;
  bool bVar5;
  Functions *pFVar6;
  VertexArrayObject vertex_array_object;
  vector<float,_std::allocator<float>_> pixels;
  Framebuffer framebuffer;
  string fragment_shader;
  string vertex_shader;
  Program program;
  VertexArrayObject local_2b8;
  vector<float,_std::allocator<float>_> local_2a8;
  Framebuffer local_290;
  string local_278;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  Program local_220;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  __len = 1;
  pFVar6 = gl;
  Utility::Framebuffer::Framebuffer(&local_290,gl,1,1);
  if (local_290.m_framebuffer_id == 0) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Unable to create framebuffer with size [1,1].\n",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    bVar5 = false;
    goto LAB_00a86e6e;
  }
  Utility::Framebuffer::bind(&local_290,(int)pFVar6,__addr,__len);
  Utility::Framebuffer::clear(&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,m_vertex_shader_code_case_2,(allocator<char> *)local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,m_fragment_shader_code_case_2,(allocator<char> *)local_1a0);
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Utility::Program::Program(&local_220,gl,&local_258,&local_278,&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  if (local_220.m_program_status.program_id == 0) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Program failed to build.\n Vertex Shader:\n",0x29);
    pGVar2 = m_vertex_shader_code_case_2;
    iVar1 = (int)(ostringstream *)&local_198;
    if (m_vertex_shader_code_case_2 == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_198[-3]);
    }
    else {
      sVar4 = strlen(m_vertex_shader_code_case_2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pGVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nVertex Shader compilation log:\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,local_220.m_vertex_shader_status.shader_log._M_dataplus._M_p,
               local_220.m_vertex_shader_status.shader_log._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nWith Fragment Shader:\n",0x17);
    pGVar2 = m_fragment_shader_code_case_2;
    if (m_fragment_shader_code_case_2 == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_198[-3]);
    }
    else {
      sVar4 = strlen(m_fragment_shader_code_case_2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pGVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nWith Fragment Shader compilation log:\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,local_220.m_fragment_shader_status.shader_log._M_dataplus._M_p,
               local_220.m_fragment_shader_status.shader_log._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"\nWith Program linkage log:\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,local_220.m_fragment_shader_status.shader_log._M_dataplus._M_p,
               local_220.m_fragment_shader_status.shader_log._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    bVar5 = false;
  }
  else {
    (*(local_220.m_gl)->useProgram)(local_220.m_program_status.program_id);
    GVar3 = (*(local_220.m_gl)->getError)();
    glu::checkError(GVar3,"glUseProgram call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x5af);
    Utility::VertexArrayObject::VertexArrayObject(&local_2b8,gl,0);
    (*(local_2b8.m_gl)->drawArrays)(local_2b8.m_primitive_type,0,1);
    GVar3 = (*(local_2b8.m_gl)->getError)();
    glu::checkError(GVar3,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x650);
    Utility::Framebuffer::readPixels(&local_2a8,&local_290);
    if (local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198,"ReadPixels error.\n",0x12);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a86ca9:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      std::ios_base::~ios_base(local_128);
      bVar5 = false;
    }
    else {
      bVar5 = ABS(*local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + -1.0) <= 0.0125;
      if (0.0125 < ABS(*local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + -1.0)) {
        local_1a0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_198,
                   "Fragment shader values of gl_Clip_distance does not match vertex shader\'s output value."
                   ,0x57);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00a86ca9;
      }
    }
    if (local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Utility::VertexArrayObject::~VertexArrayObject(&local_2b8);
  }
  Utility::Program::~Program(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
LAB_00a86e6e:
  Utility::Framebuffer::~Framebuffer(&local_290);
  return bVar5;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::ClipDistancesValuePassing(const glw::Functions& gl)
{
	/*  Make a program that consist of vertex and fragment shader stages.
	 Redeclare gl_ClipDistance with size equal to GL_MAX_CLIP_DISTANCES in
	 vertex and fragment shader. In vertex shader, assign values to
	 gl_ClipDistance array using function of clip distance index i:

	 f(i) = float(i + 1) / float(gl_MaxClipDistances).

	 Setup gl_Position with passed in attribute. Read gl_ClipDistance in the
	 fragment shader and compare them with the same function. Take into
	 account low precision errors. If compared values are not equal, discard
	 the fragment. Output distinguishable color otherwise. Check that the
	 shaders compiles and the program links successfully. Enable all
	 GL_CLIP_DISTANCEs. Draw a single GL_POINT with screen centered position
	 attribute and with a configured 1 x 1 pixel size framebuffer. Using
	 glReadPixels function, check that point's fragments were not discarded. */

	/* Creating red-color-only frambuffer. */
	gl3cts::ClipDistance::Utility::Framebuffer framebuffer(gl, 1, 1);

	if (!framebuffer.isValid())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Unable to create framebuffer with size [1,1].\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	framebuffer.bind();
	framebuffer.clear();

	/* Building program. */
	const std::string vertex_shader   = m_vertex_shader_code_case_2;
	const std::string fragment_shader = m_fragment_shader_code_case_2;

	gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader, fragment_shader);

	if (program.ProgramStatus().program_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program failed to build.\n Vertex Shader:\n"
						   << m_vertex_shader_code_case_2 << "\nVertex Shader compilation log:\n"
						   << program.VertexShaderStatus().shader_log << "\nWith Fragment Shader:\n"
						   << m_fragment_shader_code_case_2 << "\nWith Fragment Shader compilation log:\n"
						   << program.FragmentShaderStatus().shader_log << "\nWith Program linkage log:\n"
						   << program.FragmentShaderStatus().shader_log << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	program.UseProgram();

	/* Creating empty VAO. */
	gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, GL_POINTS);

	/* Draw test. */
	vertex_array_object.draw(0, 1);

	/* Fetch results. */
	std::vector<glw::GLfloat> pixels = framebuffer.readPixels();

	if (pixels.size() < 1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ReadPixels error.\n" << tcu::TestLog::EndMessage;
		return false;
	}

	/* Check results. */
	glw::GLfloat results = pixels.front();

	if (fabs(results - 1.f) > 0.0125)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Fragment shader values of gl_Clip_distance does not match vertex shader's output value."
						   << tcu::TestLog::EndMessage;
		return false;
	}

	/* Test passed. */
	return true;
}